

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::array_n
          (array_n<bool,_2,_std::allocator<bool>_> *this,
          array_n<bool,_2,_std::allocator<bool>_> *obj)

{
  int local_20;
  uint local_1c;
  int i;
  uint n;
  array_n<bool,_2,_std::allocator<bool>_> *obj_local;
  array_n<bool,_2,_std::allocator<bool>_> *this_local;
  
  std::allocator<bool>::allocator((allocator<bool> *)this);
  local_1c = 1;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    this->_dims[local_20] = obj->_dims[local_20];
    local_1c = this->_dims[local_20] * local_1c;
  }
  _alloc(this,local_1c);
  memcpy(this->_array,obj->_array,(ulong)local_1c);
  return;
}

Assistant:

array_n(const array_n &obj) {
            unsigned int n = 1;

            // Copy dims
            for(int i = 0; i < N; i++) {
                _dims[i] = obj._dims[i];
                n *= _dims[i];
            }

            // Allocate for ourselves
            _alloc(n);

            // Copy everything to our array
            memcpy(_array, obj._array, n*sizeof(T));
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }